

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# imgui_widgets.cpp
# Opt level: O3

char * ImParseFormatTrimDecorations(char *fmt,char *buf,size_t buf_size)

{
  char cVar1;
  char *pcVar2;
  char *count;
  char *fmt_00;
  
  cVar1 = *fmt;
  fmt_00 = fmt;
  while( true ) {
    if (cVar1 == '\0') {
      return fmt;
    }
    if ((cVar1 == '%') && (fmt_00[1] != '%')) break;
    fmt_00 = fmt_00 + (ulong)(cVar1 == '%') + 1;
    cVar1 = *fmt_00;
  }
  pcVar2 = ImParseFormatFindEnd(fmt_00);
  if (*pcVar2 == '\0') {
    return fmt_00;
  }
  count = pcVar2 + (1 - (long)fmt_00);
  if (buf_size <= pcVar2 + (1 - (long)fmt_00)) {
    count = (char *)buf_size;
  }
  ImStrncpy(buf,fmt_00,(size_t)count);
  return buf;
}

Assistant:

const char* ImParseFormatFindStart(const char* fmt)
{
    while (char c = fmt[0])
    {
        if (c == '%' && fmt[1] != '%')
            return fmt;
        else if (c == '%')
            fmt++;
        fmt++;
    }
    return fmt;
}